

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

pool_ptr<soul::AST::Block> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::Block>
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Block> *o)

{
  bool bVar1;
  Block *pBVar2;
  pool_ptr<soul::AST::Block> *in_RDX;
  pool_ptr<soul::AST::Block> local_28 [2];
  pool_ptr<soul::AST::Block> *o_local;
  RewritingASTVisitor *this_local;
  
  o_local = o;
  this_local = this;
  bVar1 = pool_ptr<soul::AST::Block>::operator==(in_RDX,(void *)0x0);
  if (bVar1) {
    pool_ptr<soul::AST::Block>::pool_ptr((pool_ptr<soul::AST::Block> *)this);
  }
  else {
    local_28[0].object = in_RDX->object;
    bVar1 = is_type<soul::AST::Block,soul::AST::Block>(local_28);
    checkAssertion(bVar1,"is_type<Type> (o)","visitAs",0x1cd);
    pool_ptr<soul::AST::Block>::~pool_ptr(local_28);
    pBVar2 = pool_ptr<soul::AST::Block>::operator*(in_RDX);
    pBVar2 = (Block *)visitObject((RewritingASTVisitor *)o,&pBVar2->super_Statement);
    pool_ptr<soul::AST::Block>::pool_ptr<soul::AST::Block,void>
              ((pool_ptr<soul::AST::Block> *)this,pBVar2);
  }
  return (pool_ptr<soul::AST::Block>)(Block *)this;
}

Assistant:

pool_ptr<Type> visitAs (pool_ptr<Type> o)
    {
        if (o == nullptr)
            return {};

        SOUL_ASSERT (is_type<Type> (o));
        return static_cast<Type&> (visitObject (*o));
    }